

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformpixmap.cpp
# Opt level: O1

void __thiscall QPlatformPixmap::~QPlatformPixmap(QPlatformPixmap *this)

{
  this->_vptr_QPlatformPixmap = (_func_int **)&PTR__QPlatformPixmap_007e3a18;
  if (this->is_cached != 0) {
    QImagePixmapCleanupHooks::executePlatformPixmapDestructionHooks(this);
    this->is_cached = 0;
  }
  return;
}

Assistant:

QPlatformPixmap::~QPlatformPixmap()
{
    // Sometimes the pixmap cleanup hooks will be called from derived classes, which will
    // then set is_cached to false. For example, on X11 Qt GUI needs to delete the GLXPixmap
    // or EGL Pixmap Surface for a given pixmap _before_ the native X11 pixmap is deleted,
    // otherwise some drivers will leak the GL surface. In this case, QX11PlatformPixmap will
    // call the cleanup hooks itself before deleting the native pixmap and set is_cached to
    // false.
    if (is_cached) {
        QImagePixmapCleanupHooks::executePlatformPixmapDestructionHooks(this);
        is_cached = false;
    }
}